

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int VmJsonDefaultDecoder(jx9_context *pCtx,jx9_value *pKey,jx9_value *pWorker,void *pUserData)

{
  jx9_result_value(pCtx,pWorker);
  return 0;
}

Assistant:

static int VmJsonDefaultDecoder(jx9_context *pCtx, jx9_value *pKey, jx9_value *pWorker, void *pUserData)
{
	/* Return the value directly */
	jx9_result_value(pCtx, pWorker); /* Will make it's own copy */
	SXUNUSED(pKey); /* cc warning */
	SXUNUSED(pUserData);
	/* All done */
	return SXRET_OK;
}